

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void P_BloodSplatter2(DVector3 *pos,AActor *originator,DAngle *hitangle)

{
  byte *pbVar1;
  PalEntry kind;
  int iVar2;
  int iVar3;
  PClassActor *type;
  AActor *pAVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  DAngle local_50;
  DVector3 local_48;
  
  kind = AActor::GetBloodColor(originator);
  type = AActor::GetBloodType(originator,2);
  uVar5 = cl_bloodtype.Value;
  if (type != (PClassActor *)0x0) {
    uVar5 = cl_bloodtype.Value & (*(int *)((type->super_PClass).Defaults + 0x1c8) << 4) >> 0x1f;
  }
  iVar2 = FRandom::operator()(&pr_splat);
  iVar3 = FRandom::operator()(&pr_splat);
  dVar6 = (double)(iVar2 + -0x80) * 0.03125;
  dVar7 = (double)(iVar3 + -0x80) * 0.03125;
  if (type != (PClassActor *)0x0) {
    local_48.Z = pos->Z;
    local_48.X = pos->X + dVar6;
    local_48.Y = pos->Y + dVar7;
    pAVar4 = Spawn(type,&local_48,NO_REPLACE);
    (pAVar4->target).field_0.p = originator;
    if ((kind.field_0 != 0) && (((pAVar4->flags2).Value & 0x10000) == 0)) {
      pAVar4->Translation = (uint)kind.field_0 >> 0x18 | 0x80000;
    }
    if (1 < (int)uVar5) {
      pbVar1 = (byte *)((long)&(pAVar4->renderflags).Value + 1);
      *pbVar1 = *pbVar1 | 0x80;
      goto LAB_0042e733;
    }
  }
  if ((int)uVar5 < 1) {
    return;
  }
LAB_0042e733:
  local_48.Z = pos->Z;
  local_48.X = dVar6 + pos->X;
  local_48.Y = dVar7 + pos->Y;
  local_50.Degrees = hitangle->Degrees + -180.0;
  P_DrawSplash2(0x28,&local_48,&local_50,2,(int)kind.field_0);
  return;
}

Assistant:

void P_BloodSplatter2 (const DVector3 &pos, AActor *originator, DAngle hitangle)
{
	PalEntry bloodcolor = originator->GetBloodColor();
	PClassActor *bloodcls = originator->GetBloodType(2);

	int bloodtype = cl_bloodtype;
	
	if (bloodcls != NULL && !(GetDefaultByType(bloodcls)->flags4 & MF4_ALLOWPARTICLES))
		bloodtype = 0;

	DVector2 add;
	add.X = (pr_splat() - 128) / 32.;
	add.Y = (pr_splat() - 128) / 32.;

	if (bloodcls != NULL)
	{
		AActor *mo;


		mo = Spawn (bloodcls, pos + add, NO_REPLACE); // GetBloodType already performed the replacement
		mo->target = originator;

		// colorize the blood!
		if (bloodcolor != 0 && !(mo->flags2 & MF2_DONTTRANSLATE))
		{
			mo->Translation = TRANSLATION(TRANSLATION_Blood, bloodcolor.a);
		}

		if (!(bloodtype <= 1)) mo->renderflags |= RF_INVISIBLE;
	}
	if (bloodtype >= 1)
	{
		P_DrawSplash2(40, pos + add, hitangle - 180., 2, bloodcolor);
	}
}